

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ExemptionDatabase.cpp
# Opt level: O0

ssize_t __thiscall
RenX::ExemptionDatabase::write(ExemptionDatabase *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  char *__filename;
  FILE *__stream;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  FILE *file;
  Entry *entry_local;
  ExemptionDatabase *this_local;
  ssize_t sVar2;
  
  __filename = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str(&this->m_filename);
  __stream = fopen(__filename,"r+b");
  iVar1 = fsetpos(__stream,(fpos_t *)&this->m_eof);
  sVar2 = CONCAT44(extraout_var,iVar1);
  if (__stream != (FILE *)0x0) {
    write(this,__fd,__stream,__n);
    iVar1 = fclose(__stream);
    sVar2 = CONCAT44(extraout_var_00,iVar1);
  }
  return sVar2;
}

Assistant:

void RenX::ExemptionDatabase::write(RenX::ExemptionDatabase::Entry *entry) {
	FILE *file = fopen(m_filename.c_str(), "r+b");
	fsetpos(file, std::addressof(m_eof));
	if (file != nullptr) {
		write(entry, file);
		fclose(file);
	}
}